

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall cppcms::widgets::text::text(text *this)

{
  string local_38;
  
  base_widget::base_widget((base_widget *)&(this->super_base_html_input).field_0x88);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"text","");
  base_html_input::base_html_input
            (&this->super_base_html_input,&PTR_construction_vtable_24__00289a18,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  *(undefined1 **)&(this->super_base_html_input).field_0x38 =
       &(this->super_base_html_input).field_0x48;
  *(undefined8 *)&(this->super_base_html_input).field_0x40 = 0;
  (this->super_base_html_input).field_0x48 = 0;
  *(undefined8 *)&(this->super_base_html_input).field_0x58 = 0xffffffff00000000;
  (this->super_base_html_input).field_0x60 = 1;
  *(undefined8 *)&(this->super_base_html_input).field_0x70 = 0;
  (this->super_base_html_input)._vptr_base_html_input = (_func_int **)0x289908;
  *(undefined8 *)&(this->super_base_html_input).field_0x88 = 0x2899c0;
  *(undefined8 *)&(this->super_base_html_input).field_0x30 = 0x289948;
  *(undefined4 *)&(this->super_base_html_input).field_0x78 = 0xffffffff;
  *(undefined8 *)&(this->super_base_html_input).field_0x80 = 0;
  return;
}

Assistant:

text::text(): base_html_input("text"), size_(-1) {}